

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O0

void __thiscall cmCoreTryCompile::CleanupFiles(cmCoreTryCompile *this,string *binDir)

{
  size_t *this_00;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  string *psVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  undefined1 local_138 [8];
  string m;
  undefined1 local_f8 [8];
  string fullPath;
  allocator<char> local_c1;
  value_type local_c0;
  _Base_ptr local_a0;
  undefined1 local_98;
  char *local_90;
  char *fileName;
  unsigned_long i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deletedFiles;
  Directory dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *binDir_local;
  cmCoreTryCompile *this_local;
  
  local_18 = binDir;
  binDir_local = (string *)this;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    lVar4 = std::__cxx11::string::find((char *)local_18,0x7a67d1);
    if (lVar4 == -1) {
      std::operator+(&local_38,
                     "TRY_COMPILE attempt to remove -rf directory that does not contain CMakeTmp:",
                     local_18);
      cmSystemTools::Error(&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    else {
      this_00 = &deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count;
      cmsys::Directory::Directory((Directory *)this_00);
      cmsys::Directory::Load((Directory *)this_00,local_18);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
      for (fileName = (char *)0x0; pcVar6 = fileName,
          pcVar5 = (char *)cmsys::Directory::GetNumberOfFiles
                                     ((Directory *)
                                      &deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count
                                     ), pcVar6 < pcVar5; fileName = fileName + 1) {
        local_90 = cmsys::Directory::GetFile
                             ((Directory *)
                              &deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (unsigned_long)fileName);
        iVar2 = strcmp(local_90,".");
        if ((iVar2 != 0) && (iVar2 = strcmp(local_90,".."), pcVar6 = local_90, iVar2 != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pcVar6,&local_c1);
          pVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&i,&local_c0);
          fullPath.field_2._8_8_ = pVar8.first._M_node;
          local_98 = pVar8.second;
          local_a0 = (_Base_ptr)fullPath.field_2._8_8_;
          std::__cxx11::string::~string((string *)&local_c0);
          std::allocator<char>::~allocator(&local_c1);
          if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::__cxx11::string::string((string *)(m.field_2._M_local_buf + 8),(string *)local_18);
            pcVar6 = (char *)std::__cxx11::string::append(m.field_2._M_local_buf + 8);
            psVar7 = (string *)std::__cxx11::string::append(pcVar6);
            std::__cxx11::string::string((string *)local_f8,psVar7);
            std::__cxx11::string::~string((string *)(m.field_2._M_local_buf + 8));
            bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_f8);
            if (bVar1) {
              CleanupFiles(this,(string *)local_f8);
              cmsys::SystemTools::RemoveADirectory((string *)local_f8);
            }
            else {
              bVar1 = cmsys::SystemTools::RemoveFile((string *)local_f8);
              if (!bVar1) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_138,"Remove failed on file: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_f8);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                cmSystemTools::ReportLastSystemError(pcVar6);
                std::__cxx11::string::~string((string *)local_138);
              }
            }
            std::__cxx11::string::~string((string *)local_f8);
          }
        }
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i);
      cmsys::Directory::~Directory
                ((Directory *)&deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  return;
}

Assistant:

void cmCoreTryCompile::CleanupFiles(std::string const& binDir)
{
  if (binDir.empty()) {
    return;
  }

  if (binDir.find("CMakeTmp") == std::string::npos) {
    cmSystemTools::Error(
      "TRY_COMPILE attempt to remove -rf directory that does not contain "
      "CMakeTmp:" +
      binDir);
    return;
  }

  cmsys::Directory dir;
  dir.Load(binDir);
  std::set<std::string> deletedFiles;
  for (unsigned long i = 0; i < dir.GetNumberOfFiles(); ++i) {
    const char* fileName = dir.GetFile(i);
    if (strcmp(fileName, ".") != 0 && strcmp(fileName, "..") != 0) {
      if (deletedFiles.insert(fileName).second) {
        std::string const fullPath =
          std::string(binDir).append("/").append(fileName);
        if (cmSystemTools::FileIsDirectory(fullPath)) {
          this->CleanupFiles(fullPath);
          cmSystemTools::RemoveADirectory(fullPath);
        } else {
#ifdef _WIN32
          // Sometimes anti-virus software hangs on to new files so we
          // cannot delete them immediately.  Try a few times.
          cmSystemTools::WindowsFileRetry retry =
            cmSystemTools::GetWindowsFileRetry();
          while (!cmSystemTools::RemoveFile(fullPath) && --retry.Count &&
                 cmSystemTools::FileExists(fullPath)) {
            cmSystemTools::Delay(retry.Delay);
          }
          if (retry.Count == 0)
#else
          if (!cmSystemTools::RemoveFile(fullPath))
#endif
          {
            std::string m = "Remove failed on file: " + fullPath;
            cmSystemTools::ReportLastSystemError(m.c_str());
          }
        }
      }
    }
  }
}